

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.cpp
# Opt level: O2

ostream * pstore::repo::operator<<(ostream *os,external_fixup *xfx)

{
  ostream *poVar1;
  binding local_c;
  
  poVar1 = std::operator<<(os,"{ name:");
  poVar1 = pstore::operator<<(poVar1,&xfx->name);
  poVar1 = std::operator<<(poVar1,", type:");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", binding:");
  local_c = (binding)xfx->is_weak;
  poVar1 = operator<<(poVar1,&local_c);
  poVar1 = std::operator<<(poVar1,", offset:");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", addend:");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1,'}');
  return poVar1;
}

Assistant:

std::ostream & operator<< (std::ostream & os, external_fixup const & xfx) {
            return os << "{ name:" << xfx.name << ", type:" << static_cast<unsigned> (xfx.type)
                      << ", binding:" << xfx.strength () << ", offset:" << xfx.offset
                      << ", addend:" << xfx.addend << '}';
        }